

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_relation.cpp
# Opt level: O0

void __thiscall
duckdb::ValueRelation::ValueRelation
          (ValueRelation *this,shared_ptr<duckdb::ClientContext,_true> *context,string *values_list,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names_p,string *alias_p)

{
  ParserOptions options;
  Relation *in_RDI;
  string *in_R8;
  string *in_stack_000000e8;
  undefined1 in_stack_00000100 [16];
  vector<duckdb::ParserExtension,_true> *in_stack_00000110;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *in_stack_ffffffffffffff28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *in_stack_ffffffffffffff30;
  ClientContext *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff60;
  shared_ptr<duckdb::ClientContext,_true> *in_stack_ffffffffffffff68;
  vector<duckdb::ColumnDefinition,_true> *local_58;
  Relation *pRStack_50;
  
  Relation::Relation(in_RDI,in_stack_ffffffffffffff68,
                     (RelationType)((ulong)in_stack_ffffffffffffff60 >> 0x38));
  in_RDI->_vptr_Relation = (_func_int **)&PTR__ValueRelation_035333b8;
  vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_true>
  ::vector((vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_true>
            *)0x1960519);
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
  vector(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  vector<duckdb::ColumnDefinition,_true>::vector
            ((vector<duckdb::ColumnDefinition,_true> *)0x1960547);
  ::std::__cxx11::string::string((string *)(in_RDI[1].alias.field_2._M_local_buf + 8),in_R8);
  shared_ptr<duckdb::ClientContext,_true>::operator->
            ((shared_ptr<duckdb::ClientContext,_true> *)in_stack_ffffffffffffff30);
  ClientContext::GetParserOptions(in_stack_ffffffffffffff40);
  options.extensions = in_stack_00000110;
  options._0_16_ = in_stack_00000100;
  Parser::ParseValuesList(in_stack_000000e8,options);
  vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_true>
  ::operator=((vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_true>
               *)pRStack_50,
              (vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_true>
               *)local_58);
  vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_true>
  ::~vector((vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_true>
             *)0x19605ea);
  QueryResult::DeduplicateColumns
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)in_stack_00000110);
  Relation::TryBindRelation(pRStack_50,local_58);
  return;
}

Assistant:

ValueRelation::ValueRelation(const shared_ptr<ClientContext> &context, const string &values_list,
                             vector<string> names_p, string alias_p)
    : Relation(context, RelationType::VALUE_LIST_RELATION), names(std::move(names_p)), alias(std::move(alias_p)) {
	this->expressions = Parser::ParseValuesList(values_list, context->GetParserOptions());
	QueryResult::DeduplicateColumns(names);
	TryBindRelation(columns);
}